

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O3

void __thiscall
BasicContainer::build
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list,
          treenode **cur)

{
  AABox *a;
  BasicPrimitive *pBVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  BasicContainer *this_00;
  treenode **pptVar6;
  treenode *ptVar7;
  ulong uVar8;
  pointer ppBVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  _Iter_comp_iter<bool_(*)(BasicPrimitive_*,_BasicPrimitive_*)> __comp;
  long lVar14;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  __last;
  code *pcVar15;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  _Var16;
  ulong uVar17;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  _Var18;
  float fVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  float fVar23;
  float fVar24;
  AABox accu;
  vector<float,_std::allocator<float>_> prefix_area;
  vector<float,_std::allocator<float>_> suffix_area;
  AABox local_108;
  undefined1 local_e8 [8];
  pointer pfStack_e0;
  pointer local_d8;
  AABox local_d0;
  pointer local_b8;
  pointer pfStack_b0;
  pointer local_a8;
  undefined1 local_98 [16];
  BasicContainer *local_88;
  treenode **local_80;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_78;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_60;
  AABox local_48;
  
  local_98._8_8_ = local_98._0_8_;
  ptVar7 = *cur;
  if (ptVar7 == (treenode *)0x0) {
    ptVar7 = (treenode *)operator_new(0x30);
    ptVar7->lc = (treenode *)0x0;
    ptVar7->rc = (treenode *)0x0;
    ptVar7->shape = (BasicPrimitive *)0x0;
    (ptVar7->bound).x1 = 0.0;
    (ptVar7->bound).x2 = 0.0;
    (ptVar7->bound).y1 = 0.0;
    (ptVar7->bound).y2 = 0.0;
    (ptVar7->bound).z1 = 0.0;
    (ptVar7->bound).z2 = 0.0;
    *cur = ptVar7;
  }
  ppBVar9 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppBVar9 == 8) {
    pBVar1 = *ppBVar9;
    ptVar7->shape = pBVar1;
    (*(pBVar1->super_Primitive)._vptr_Primitive[1])(local_e8);
    ptVar7 = *cur;
    *(pointer *)&(ptVar7->bound).z1 = local_d8;
    (ptVar7->bound).x1 = (float)local_e8._0_4_;
    (ptVar7->bound).x2 = (float)local_e8._4_4_;
    *(pointer *)&(ptVar7->bound).y1 = pfStack_e0;
  }
  else {
    local_88 = this;
    local_80 = cur;
    (*((*ppBVar9)->super_Primitive)._vptr_Primitive[1])(local_e8);
    *(pointer *)&(ptVar7->bound).z1 = local_d8;
    (ptVar7->bound).x1 = (float)local_e8._0_4_;
    (ptVar7->bound).x2 = (float)local_e8._4_4_;
    *(pointer *)&(ptVar7->bound).y1 = pfStack_e0;
    _Var18._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    uVar8 = (long)__last._M_current - (long)_Var18._M_current >> 3;
    local_98._0_8_ = ptVar7;
    if (1 < uVar8) {
      a = &ptVar7->bound;
      uVar17 = 1;
      do {
        (*(_Var18._M_current[uVar17]->super_Primitive)._vptr_Primitive[1])((AABox *)&local_b8);
        operator+((AABox *)local_e8,a,(AABox *)&local_b8);
        *(pointer *)&(ptVar7->bound).z1 = local_d8;
        a->x1 = (float)local_e8._0_4_;
        a->x2 = (float)local_e8._4_4_;
        *(pointer *)&(ptVar7->bound).y1 = pfStack_e0;
        uVar17 = uVar17 + 1;
        _Var18._M_current =
             (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_start;
        __last._M_current =
             (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        uVar8 = (long)__last._M_current - (long)_Var18._M_current >> 3;
      } while (uVar17 < uVar8);
    }
    _Var16._M_current = __last._M_current;
    if (_Var18._M_current != __last._M_current) {
      fVar19 = *(float *)(local_98._0_8_ + 0x2c) - *(float *)(local_98._0_8_ + 0x28);
      fVar23 = *(float *)(local_98._0_8_ + 0x1c) - *(float *)(local_98._0_8_ + 0x18);
      fVar24 = *(float *)(local_98._0_8_ + 0x24) - *(float *)(local_98._0_8_ + 0x20);
      pcVar15 = build::anon_class_1_0_00000001::__invoke;
      if (fVar23 < fVar24) {
        pcVar15 = build::anon_class_1_0_00000001::__invoke;
      }
      __comp._M_comp = build::anon_class_1_0_00000001::__invoke;
      if (fVar19 <= fVar23 || fVar19 <= fVar24) {
        __comp._M_comp = pcVar15;
      }
      lVar11 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(BasicPrimitive*,BasicPrimitive*)>>
                (_Var18,__last,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,__comp);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(BasicPrimitive*,BasicPrimitive*)>>
                (_Var18,__last,__comp);
      __last._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
      _Var16._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    local_e8 = (undefined1  [8])0x0;
    pfStack_e0 = (pointer)0x0;
    local_d8 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    pfStack_b0 = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_e8,
               (long)_Var16._M_current - (long)__last._M_current >> 3);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&local_b8,
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    (*((*(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->super_Primitive)._vptr_Primitive[1])(&local_108);
    ppBVar9 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppBVar9) {
      lVar11 = 0;
    }
    else {
      uVar8 = 0;
      do {
        (*(ppBVar9[uVar8]->super_Primitive)._vptr_Primitive[1])(&local_48);
        operator+(&local_d0,&local_108,&local_48);
        local_108.z1 = local_d0.z1;
        local_108.z2 = local_d0.z2;
        uVar5 = local_108._16_8_;
        local_108.x1 = local_d0.x1;
        local_108.x2 = local_d0.x2;
        uVar3 = local_108._0_8_;
        local_108.y1 = local_d0.y1;
        local_108.y2 = local_d0.y2;
        uVar4 = local_108._8_8_;
        local_108.x2 = local_d0.x2;
        local_108.y2 = local_d0.y2;
        local_108.x1 = local_d0.x1;
        local_108.y1 = local_d0.y1;
        local_108.z2 = local_d0.z2;
        local_108.z1 = local_d0.z1;
        fVar19 = (local_108.z2 - local_108.z1) * (local_108.y2 - local_108.y1) +
                 (local_108.x2 - local_108.x1) * (local_108.y2 - local_108.y1) +
                 (local_108.x2 - local_108.x1) * (local_108.z2 - local_108.z1);
        *(float *)((long)local_e8 + uVar8 * 4) = fVar19 + fVar19;
        uVar8 = uVar8 + 1;
        ppBVar9 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        lVar11 = (long)(list->
                       super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar9;
        local_108._0_8_ = uVar3;
        local_108._8_8_ = uVar4;
        local_108._16_8_ = uVar5;
      } while (uVar8 < (ulong)(lVar11 >> 3));
    }
    (**(code **)(**(long **)((long)ppBVar9 + lVar11 + -8) + 8))(&local_d0);
    local_108.z1 = local_d0.z1;
    local_108.z2 = local_d0.z2;
    local_108.x1 = local_d0.x1;
    local_108.x2 = local_d0.x2;
    local_108.y1 = local_d0.y1;
    local_108.y2 = local_d0.y2;
    _Var18._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    uVar8 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)_Var18._M_current;
    uVar10 = (int)(uVar8 >> 3) - 1;
    if (-1 < (int)uVar10) {
      lVar11 = (ulong)uVar10 + 1;
      do {
        (*((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar11 + -1]->super_Primitive)._vptr_Primitive[1])
                  (&local_48);
        operator+(&local_d0,&local_108,&local_48);
        local_108.z1 = local_d0.z1;
        local_108.z2 = local_d0.z2;
        uVar5 = local_108._16_8_;
        local_108.x1 = local_d0.x1;
        local_108.x2 = local_d0.x2;
        uVar3 = local_108._0_8_;
        local_108.y1 = local_d0.y1;
        local_108.y2 = local_d0.y2;
        uVar4 = local_108._8_8_;
        local_108.x2 = local_d0.x2;
        local_108.x1 = local_d0.x1;
        local_108.y2 = local_d0.y2;
        local_108.y1 = local_d0.y1;
        local_108.z2 = local_d0.z2;
        local_108.z1 = local_d0.z1;
        fVar19 = (local_108.z2 - local_108.z1) * (local_108.y2 - local_108.y1) +
                 (local_108.x2 - local_108.x1) * (local_108.y2 - local_108.y1) +
                 (local_108.x2 - local_108.x1) * (local_108.z2 - local_108.z1);
        local_b8[lVar11 + -1] = fVar19 + fVar19;
        lVar14 = lVar11 + -1;
        bVar2 = 0 < lVar11;
        lVar11 = lVar14;
      } while (lVar14 != 0 && bVar2);
      _Var18._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
      uVar8 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)_Var18._M_current;
      local_108._0_8_ = uVar3;
      local_108._8_8_ = uVar4;
      local_108._16_8_ = uVar5;
    }
    auVar21._8_4_ = (int)((long)uVar8 >> 0x23);
    auVar21._0_8_ = (long)uVar8 >> 3;
    auVar21._12_4_ = 0x45300000;
    dVar22 = auVar21._8_8_ - 1.9342813113834067e+25;
    dVar20 = dVar22 + ((double)CONCAT44(0x43300000,(int)((long)uVar8 >> 3)) - 4503599627370496.0);
    local_98._8_4_ = SUB84(dVar22,0);
    local_98._0_8_ = dVar20;
    local_98._12_4_ = (int)((ulong)dVar22 >> 0x20);
    dVar20 = round(dVar20 * 0.15);
    iVar12 = (int)dVar20;
    dVar20 = round((double)local_98._0_8_ * 0.85);
    iVar13 = iVar12;
    if (iVar12 < (int)(dVar20 + -1.0)) {
      lVar11 = (long)iVar12;
      lVar14 = 0;
      do {
        if (*(float *)((long)local_e8 + (lVar11 + lVar14) * 4) + local_b8[lVar11 + lVar14 + 1] <
            *(float *)((long)local_e8 + (long)iVar13 * 4) + local_b8[(long)iVar13 + 1]) {
          iVar13 = iVar12 + (int)lVar14;
        }
        lVar14 = lVar14 + 1;
      } while ((int)(dVar20 + -1.0) - lVar11 != lVar14);
    }
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_60,_Var18,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(_Var18._M_current + (long)iVar13 + 1),(allocator_type *)&local_d0);
    pptVar6 = local_80;
    this_00 = local_88;
    build(local_88,&local_60,&(*local_80)->lc);
    if (local_60.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_78,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar13 + 1),
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_d0);
    build(this_00,&local_78,&(*pptVar6)->rc);
    if (local_78.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8 != (pointer)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    if (local_e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_e8,(long)local_d8 - (long)local_e8);
    }
  }
  return;
}

Assistant:

void build(std::vector<BasicPrimitive*> list, treenode*& cur)
	{
		// create tree node
		if (!cur) {
			cur = new treenode();
		}
		// bind shape to leaf nodes
		if (list.size() == 1)
		{
			cur->shape = list[0];
			cur->bound = list[0]->boundingVolume();
			return;
		}
		// compute bounding box
		AABox& bound = cur->bound;
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
		// sort in sparsest dimension
		auto cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
			return a->boundingVolume().x1 < b->boundingVolume().x1;
		};
		if (bound.y2 - bound.y1 > bound.x2 - bound.x1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().y1 < b->boundingVolume().y1;
			};
		}
		if (bound.z2 - bound.z1 > bound.x2 - bound.x1 &&
			bound.z2 - bound.z1 > bound.y2 - bound.y1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().z1 < b->boundingVolume().z1;
			};
		}
		std::sort(list.begin(), list.end(), cmp);
		// determine split position to minimize sum of surface area of bounding boxes
		std::vector<float> prefix_area, suffix_area;
		prefix_area.resize(list.size());
		suffix_area.resize(list.size());
		AABox accu = list[0]->boundingVolume();
		for (int i=0; i<list.size(); ++i) {
			accu = accu + list[i]->boundingVolume();
			prefix_area[i] = accu.surfaceArea();
		}
		accu = list[list.size()-1]->boundingVolume();
		for (int i=list.size()-1; i>=0; --i) {
			accu = accu + list[i]->boundingVolume();
			suffix_area[i] = accu.surfaceArea();
		}
		int rangemin = round(list.size()*0.15);
		int rangemax = round(list.size()*0.85)-1;
		// limit split point from being too close to side
		int best = rangemin;
		for (int i=rangemin; i<rangemax; ++i) {
			if (prefix_area[i] + suffix_area[i+1] < prefix_area[best] + suffix_area[best+1])
				best = i;
		}
		// recursive partition
		build(std::vector<BasicPrimitive*>(list.begin(), list.begin()+best+1), cur->lc);
		build(std::vector<BasicPrimitive*>(list.begin()+best+1, list.end()), cur->rc);
	}